

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_affine.h
# Opt level: O0

longdouble * __thiscall
mp::LinTerms::ComputeValue<mp::ArrayRef<double>>(LinTerms *this,ArrayRef<double> *x)

{
  ArrayRef<double> *this_00;
  longdouble *plVar1;
  double *pdVar2;
  int *piVar3;
  ArrayRef<double> *in_RSI;
  size_t i;
  longdouble s;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined6 uStack_c0;
  ArrayRef<int> local_a8;
  ArrayRef<double> local_80;
  ArrayRef<double> local_58;
  longdouble *local_30;
  longdouble local_28;
  ArrayRef<double> *local_10;
  
  local_28 = (longdouble)0;
  local_10 = in_RSI;
  coefs((LinTerms *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  plVar1 = (longdouble *)ArrayRef<double>::size(&local_58);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x38c509);
  local_30 = plVar1;
  while( true ) {
    if (local_30 == (longdouble *)0x0) break;
    local_30 = (longdouble *)((long)local_30 - 1);
    coefs((LinTerms *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pdVar2 = ArrayRef<double>::operator[](&local_80,(size_t)local_30);
    this_00 = local_10;
    in_stack_ffffffffffffff3c = SUB104((longdouble)*pdVar2,0);
    uStack_c0 = (undefined6)((unkuint10)(longdouble)*pdVar2 >> 0x20);
    vars((LinTerms *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    piVar3 = ArrayRef<int>::operator[](&local_a8,(size_t)local_30);
    pdVar2 = ArrayRef<double>::operator[](this_00,(long)*piVar3);
    local_28 = (longdouble)CONCAT64(uStack_c0,in_stack_ffffffffffffff3c) * (longdouble)*pdVar2 +
               local_28;
    ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x38c5c7);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x38c5d1);
  }
  return local_30;
}

Assistant:

long double ComputeValue(const VarInfo& x) const {
    long double s=0.0;
    for (size_t i=coefs().size(); i--; )
      s += (long double)(coefs()[i]) * x[vars()[i]];
    return s;
  }